

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::get_hash_for_raytracing_pipeline_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  VkPipeline pVVar1;
  bool bVar2;
  iterator iVar3;
  long *in_FS_OFFSET;
  VkPipeline local_18;
  
  local_18 = pipeline;
  iVar3 = std::
          _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->impl->raytracing_pipeline_to_hash)._M_h,&local_18);
  pVVar1 = local_18;
  if (iVar3.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    if (*(int *)(*in_FS_OFFSET + -0x20) < 2) {
      bVar2 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                         ,"Raytracing pipeline",local_18);
      if (!bVar2) {
        fprintf(_stderr,
                "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                ,"Raytracing pipeline",pVVar1);
      }
    }
  }
  else {
    *hash = *(Hash *)((long)iVar3.
                            super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>
                            ._M_cur + 0x10);
  }
  return iVar3.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::get_hash_for_raytracing_pipeline_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->raytracing_pipeline_to_hash.find(pipeline);
	if (itr == end(impl->raytracing_pipeline_to_hash))
	{
		log_failed_hash("Raytracing pipeline", pipeline);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}